

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O2

size_t google::protobuf::internal::
       MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
       ::ByteSizeLong(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
                     Function *value)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  
  sVar2 = WireFormatLite::StringSize(key);
  sVar3 = WireFormatLite::MessageSizeNoVirtual<CoreML::Specification::MILSpec::Function>(value);
  lVar4 = sVar3 + (long)((int)sVar2 + 2);
  uVar5 = (uint)lVar4 | 1;
  iVar1 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  return lVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6);
}

Assistant:

static size_t ByteSizeLong(const Key& key, const Value& value) {
    // Tags for key and value will both be one byte (field numbers 1 and 2).
    size_t inner_length =
        2 + KeyTypeHandler::ByteSize(key) + ValueTypeHandler::ByteSize(value);
    return inner_length + io::CodedOutputStream::VarintSize32(
                              static_cast<uint32_t>(inner_length));
  }